

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_top_n.cpp
# Opt level: O0

void __thiscall
duckdb::TopNBoundaryValue::TopNBoundaryValue(TopNBoundaryValue *this,PhysicalTopN *op)

{
  Vector *this_00;
  const_reference pvVar1;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  LogicalType *in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  OrderType order_type;
  LogicalType *type_p;
  
  *in_RDI = in_RSI;
  ::std::mutex::mutex((mutex *)0x185a5b2);
  ::std::__cxx11::string::string((string *)(in_RDI + 6));
  *(undefined1 *)(in_RDI + 10) = 0;
  type_p = (LogicalType *)(in_RDI + 0xb);
  this_00 = (Vector *)
            vector<duckdb::BoundOrderByNode,_true>::operator[]
                      ((vector<duckdb::BoundOrderByNode,_true> *)
                       CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                       (size_type)in_stack_ffffffffffffff78);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  LogicalType::LogicalType
            ((LogicalType *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff78);
  Vector::Vector(this_00,type_p,(idx_t)in_RDI);
  LogicalType::~LogicalType((LogicalType *)0x185a63a);
  pvVar1 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                     ((vector<duckdb::BoundOrderByNode,_true> *)
                      CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                      (size_type)in_stack_ffffffffffffff78);
  order_type = pvVar1->type;
  pvVar1 = vector<duckdb::BoundOrderByNode,_true>::operator[]
                     ((vector<duckdb::BoundOrderByNode,_true> *)
                      CONCAT17(order_type,in_stack_ffffffffffffff80),
                      (size_type)in_stack_ffffffffffffff78);
  OrderModifiers::OrderModifiers((OrderModifiers *)(in_RDI + 0x18),order_type,pvVar1->null_order);
  return;
}

Assistant:

explicit TopNBoundaryValue(const PhysicalTopN &op)
	    : op(op), boundary_vector(op.orders[0].expression->return_type),
	      boundary_modifiers(op.orders[0].type, op.orders[0].null_order) {
	}